

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_request_state(connectdata *conn,_Bool *done)

{
  curl_off_t *pcVar1;
  _Bool _Var2;
  undefined2 uVar3;
  int *piVar4;
  char *pcVar5;
  Curl_easy *pCVar6;
  curl_off_t cVar7;
  void *pvVar8;
  unsigned_short uVar9;
  unsigned_short uVar10;
  CURLcode CVar11;
  CURLcode CVar12;
  __pid_t _Var13;
  size_t sVar14;
  size_t sVar15;
  int iVar16;
  size_t sVar17;
  uchar cmd;
  long lVar18;
  ulong len;
  uint uVar19;
  short sVar20;
  smb_request *req;
  bool bVar21;
  void *msg;
  smb_tree_disconnect msg_1;
  void *local_470;
  undefined1 local_468;
  undefined1 uStack_467;
  undefined1 uStack_466;
  undefined2 uStack_465;
  undefined1 uStack_463;
  undefined1 uStack_462;
  undefined1 uStack_461;
  undefined1 uStack_460;
  short sStack_45f;
  undefined2 uStack_45d;
  char acStack_45b [2];
  uint uStack_459;
  char acStack_455 [2];
  undefined4 local_453;
  undefined2 uStack_44f;
  char acStack_448 [4];
  int iStack_444;
  short sStack_437;
  char acStack_435 [1029];
  
  piVar4 = (int *)(conn->data->req).protop;
  local_470 = (void *)0x0;
  if (*piVar4 == 0) {
    pcVar5 = (conn->host).name;
    sVar14 = strlen(pcVar5);
    sVar15 = strlen(*(char **)(piVar4 + 2));
    CVar11 = CURLE_FILESIZE_EXCEEDED;
    if (0xfffffffffffffbfe < (sVar15 + sVar14) - 0x3f7) {
      memset(&local_468,0,0x40b);
      local_468 = 4;
      uStack_467 = 0xff;
      uStack_461 = 0;
      uStack_460 = 0;
      uStack_45d = 0x5c5c;
      acStack_45b[0] = '\0';
      strcpy(acStack_45b,pcVar5);
      sVar14 = strlen(pcVar5);
      (acStack_45b + sVar14)[0] = '\\';
      (acStack_45b + sVar14)[1] = '\0';
      strcpy(acStack_45b + sVar14 + 1,*(char **)(piVar4 + 2));
      sVar15 = strlen(*(char **)(piVar4 + 2));
      builtin_strncpy(acStack_455 + sVar15 + sVar14 + -4,"?????",6);
      sStack_45f = (short)(acStack_45b + ((sVar15 + sVar14) - (long)&uStack_45d) + 1) + 7;
      CVar11 = smb_send_message(conn,'u',&local_468,
                                (size_t)(acStack_45b + ((sVar15 + sVar14) - (long)&uStack_45d) + 1 +
                                        0x12));
    }
    if (CVar11 != CURLE_OK) goto LAB_0013e59e;
    *(undefined4 *)(conn->data->req).protop = 1;
  }
  CVar11 = smb_send_and_recv(conn,&local_470);
  pvVar8 = local_470;
  if ((CVar11 != CURLE_OK) && (CVar11 != CURLE_AGAIN)) {
LAB_0013e59e:
    Curl_conncontrol(conn,1);
    return CVar11;
  }
  CVar11 = CURLE_OK;
  if (local_470 == (void *)0x0) {
    return CURLE_OK;
  }
  switch(*piVar4) {
  case 1:
    if (*(int *)((long)local_470 + 9) != 0) {
      iVar16 = 0x4e;
      if (*(int *)((long)local_470 + 9) == 0x50001) {
        iVar16 = 9;
      }
      piVar4[7] = iVar16;
      (conn->proto).ftpc.pp.response.tv_usec = 0;
      goto LAB_0013ebc4;
    }
    *(undefined2 *)(piVar4 + 6) = *(undefined2 *)((long)local_470 + 0x1c);
    uVar19 = 2;
    (conn->proto).ftpc.pp.response.tv_usec = 0;
    pCVar6 = conn->data;
    pvVar8 = (pCVar6->req).protop;
    sVar14 = strlen(*(char **)((long)pvVar8 + 0x10));
    CVar12 = CURLE_FILESIZE_EXCEEDED;
    if (sVar14 - 0x400 < 0xfffffffffffffbff) goto LAB_0013eb8c;
    memset(&local_468,0,0x433);
    local_468 = 0x18;
    uStack_467 = 0xff;
    pcVar5 = *(char **)((long)pvVar8 + 0x10);
    sVar14 = strlen(pcVar5);
    uStack_462 = (undefined1)sVar14;
    uStack_461 = (undefined1)(sVar14 >> 8);
    acStack_448[0] = '\a';
    acStack_448[1] = '\0';
    acStack_448[2] = '\0';
    acStack_448[3] = '\0';
    _Var2 = (pCVar6->set).upload;
    acStack_455[0] = (_Var2 - 2U) * '@';
    iStack_444 = (uint)_Var2 * 4 + 1;
    uStack_459 = (uint)(byte)uStack_459;
    sStack_437 = (short)sVar14 + 1;
    strcpy(acStack_435,pcVar5);
    sVar17 = sVar14 + 0x34;
    cmd = 0xa2;
    goto LAB_0013eb84;
  case 2:
    if ((*(int *)((long)local_470 + 9) == 0) && (99 < (ulong)(conn->proto).ftpc.pp.response.tv_usec)
       ) {
      *(undefined2 *)((long)piVar4 + 0x1a) = *(undefined2 *)((long)local_470 + 0x2a);
      pCVar6 = conn->data;
      (pCVar6->req).offset = 0;
      if ((pCVar6->set).upload == true) {
        cVar7 = (pCVar6->state).infilesize;
        (pCVar6->req).size = cVar7;
        Curl_pgrsSetUploadSize(pCVar6,cVar7);
        uVar19 = 4;
        (conn->proto).ftpc.pp.response.tv_usec = 0;
switchD_0013e7d7_caseD_1:
        pCVar6 = conn->data;
        pvVar8 = (pCVar6->req).protop;
        cVar7 = (pCVar6->req).offset;
        sVar17 = (pCVar6->req).size - (pCVar6->req).bytecount;
        if (0x7ffe < (long)sVar17) {
          sVar17 = 0x7fff;
        }
        (pCVar6->state).uploadbuffer[0x20] = '\0';
        (pCVar6->state).uploadbuffer[0x21] = '\0';
        (pCVar6->state).uploadbuffer[0x22] = '\0';
        (pCVar6->state).uploadbuffer[0x23] = '\0';
        (pCVar6->state).uploadbuffer[0x24] = '\0';
        (pCVar6->state).uploadbuffer[0x25] = '\0';
        (pCVar6->state).uploadbuffer[0x26] = '\0';
        (pCVar6->state).uploadbuffer[0x27] = '\0';
        (pCVar6->state).uploadbuffer[0x28] = '\0';
        (pCVar6->state).uploadbuffer[0x29] = '\0';
        (pCVar6->state).uploadbuffer[0x2a] = '\0';
        (pCVar6->state).uploadbuffer[0x2b] = '\0';
        (pCVar6->state).uploadbuffer[0x2c] = '\0';
        (pCVar6->state).uploadbuffer[0x2d] = '\0';
        (pCVar6->state).uploadbuffer[0x2e] = '\0';
        (pCVar6->state).uploadbuffer[0x2f] = '\0';
        (pCVar6->state).uploadbuffer[0] = '\0';
        (pCVar6->state).uploadbuffer[1] = '\0';
        (pCVar6->state).uploadbuffer[2] = '\0';
        (pCVar6->state).uploadbuffer[3] = '\0';
        (pCVar6->state).uploadbuffer[4] = '\0';
        (pCVar6->state).uploadbuffer[5] = '\0';
        (pCVar6->state).uploadbuffer[6] = '\0';
        (pCVar6->state).uploadbuffer[7] = '\0';
        (pCVar6->state).uploadbuffer[8] = '\0';
        (pCVar6->state).uploadbuffer[9] = '\0';
        (pCVar6->state).uploadbuffer[10] = '\0';
        (pCVar6->state).uploadbuffer[0xb] = '\0';
        (pCVar6->state).uploadbuffer[0xc] = '\0';
        (pCVar6->state).uploadbuffer[0xd] = '\0';
        (pCVar6->state).uploadbuffer[0xe] = '\0';
        (pCVar6->state).uploadbuffer[0xf] = '\0';
        (pCVar6->state).uploadbuffer[0x10] = '\0';
        (pCVar6->state).uploadbuffer[0x11] = '\0';
        (pCVar6->state).uploadbuffer[0x12] = '\0';
        (pCVar6->state).uploadbuffer[0x13] = '\0';
        (pCVar6->state).uploadbuffer[0x14] = '\0';
        (pCVar6->state).uploadbuffer[0x15] = '\0';
        (pCVar6->state).uploadbuffer[0x16] = '\0';
        (pCVar6->state).uploadbuffer[0x17] = '\0';
        (pCVar6->state).uploadbuffer[0x18] = '\0';
        (pCVar6->state).uploadbuffer[0x19] = '\0';
        (pCVar6->state).uploadbuffer[0x1a] = '\0';
        (pCVar6->state).uploadbuffer[0x1b] = '\0';
        (pCVar6->state).uploadbuffer[0x1c] = '\0';
        (pCVar6->state).uploadbuffer[0x1d] = '\0';
        (pCVar6->state).uploadbuffer[0x1e] = '\0';
        (pCVar6->state).uploadbuffer[0x1f] = '\0';
        (pCVar6->state).uploadbuffer[0x30] = '\0';
        (pCVar6->state).uploadbuffer[0x31] = '\0';
        (pCVar6->state).uploadbuffer[0x32] = '\0';
        (pCVar6->state).uploadbuffer[0x33] = '\0';
        (pCVar6->state).uploadbuffer[0x34] = '\0';
        (pCVar6->state).uploadbuffer[0x35] = '\0';
        (pCVar6->state).uploadbuffer[0x36] = '\0';
        (pCVar6->state).uploadbuffer[0x37] = '\0';
        (pCVar6->state).uploadbuffer[0x38] = '\0';
        (pCVar6->state).uploadbuffer[0x39] = '\0';
        (pCVar6->state).uploadbuffer[0x3a] = '\0';
        (pCVar6->state).uploadbuffer[0x3b] = '\0';
        (pCVar6->state).uploadbuffer[0x3c] = '\0';
        (pCVar6->state).uploadbuffer[0x3d] = '\0';
        (pCVar6->state).uploadbuffer[0x3e] = '\0';
        (pCVar6->state).uploadbuffer[0x3f] = '\0';
        (pCVar6->state).uploadbuffer[0x40] = '\0';
        (pCVar6->state).uploadbuffer[0x41] = '\0';
        (pCVar6->state).uploadbuffer[0x42] = '\0';
        (pCVar6->state).uploadbuffer[0x43] = '\0';
        (pCVar6->state).uploadbuffer[0x24] = '\x0e';
        (pCVar6->state).uploadbuffer[0x25] = -1;
        *(undefined2 *)((pCVar6->state).uploadbuffer + 0x29) = *(undefined2 *)((long)pvVar8 + 0x1a);
        *(int *)((pCVar6->state).uploadbuffer + 0x2b) = (int)cVar7;
        *(int *)((pCVar6->state).uploadbuffer + 0x3d) = (int)((ulong)cVar7 >> 0x20);
        sVar20 = (short)sVar17;
        *(short *)((pCVar6->state).uploadbuffer + 0x39) = sVar20;
        (pCVar6->state).uploadbuffer[0x3b] = '@';
        (pCVar6->state).uploadbuffer[0x3c] = '\0';
        *(short *)((pCVar6->state).uploadbuffer + 0x41) = sVar20 + 1;
        pvVar8 = (conn->data->req).protop;
        (pCVar6->state).uploadbuffer[0] = '\0';
        (pCVar6->state).uploadbuffer[1] = '\0';
        (pCVar6->state).uploadbuffer[2] = '\0';
        (pCVar6->state).uploadbuffer[3] = '\0';
        (pCVar6->state).uploadbuffer[4] = '\0';
        (pCVar6->state).uploadbuffer[5] = '\0';
        (pCVar6->state).uploadbuffer[6] = '\0';
        (pCVar6->state).uploadbuffer[7] = '\0';
        (pCVar6->state).uploadbuffer[8] = '\0';
        (pCVar6->state).uploadbuffer[9] = '\0';
        (pCVar6->state).uploadbuffer[10] = '\0';
        (pCVar6->state).uploadbuffer[0xb] = '\0';
        (pCVar6->state).uploadbuffer[0xc] = '\0';
        (pCVar6->state).uploadbuffer[0xd] = '\0';
        (pCVar6->state).uploadbuffer[0xe] = '\0';
        (pCVar6->state).uploadbuffer[0xf] = '\0';
        (pCVar6->state).uploadbuffer[0x20] = '\0';
        (pCVar6->state).uploadbuffer[0x21] = '\0';
        (pCVar6->state).uploadbuffer[0x22] = '\0';
        (pCVar6->state).uploadbuffer[0x23] = '\0';
        (pCVar6->state).uploadbuffer[0x10] = '\0';
        (pCVar6->state).uploadbuffer[0x11] = '\0';
        (pCVar6->state).uploadbuffer[0x12] = '\0';
        (pCVar6->state).uploadbuffer[0x13] = '\0';
        (pCVar6->state).uploadbuffer[0x14] = '\0';
        (pCVar6->state).uploadbuffer[0x15] = '\0';
        (pCVar6->state).uploadbuffer[0x16] = '\0';
        (pCVar6->state).uploadbuffer[0x17] = '\0';
        (pCVar6->state).uploadbuffer[0x18] = '\0';
        (pCVar6->state).uploadbuffer[0x19] = '\0';
        (pCVar6->state).uploadbuffer[0x1a] = '\0';
        (pCVar6->state).uploadbuffer[0x1b] = '\0';
        (pCVar6->state).uploadbuffer[0x1c] = '\0';
        (pCVar6->state).uploadbuffer[0x1d] = '\0';
        (pCVar6->state).uploadbuffer[0x1e] = '\0';
        (pCVar6->state).uploadbuffer[0x1f] = '\0';
        *(ushort *)((pCVar6->state).uploadbuffer + 2) =
             (sVar20 + 0x40U) * 0x100 | (ushort)(sVar20 + 0x40U) >> 8;
        (pCVar6->state).uploadbuffer[4] = -1;
        (pCVar6->state).uploadbuffer[5] = 'S';
        (pCVar6->state).uploadbuffer[6] = 'M';
        (pCVar6->state).uploadbuffer[7] = 'B';
        (pCVar6->state).uploadbuffer[8] = '/';
        (pCVar6->state).uploadbuffer[0xd] = '\x18';
        (pCVar6->state).uploadbuffer[0xe] = 'A';
        (pCVar6->state).uploadbuffer[0xf] = '\0';
        *(unsigned_short *)((pCVar6->state).uploadbuffer + 0x20) = (conn->proto).smbc.uid;
        *(undefined2 *)((pCVar6->state).uploadbuffer + 0x1c) = *(undefined2 *)((long)pvVar8 + 0x18);
        _Var13 = getpid();
        *(short *)((pCVar6->state).uploadbuffer + 0x10) = (short)((uint)_Var13 >> 0x10);
        *(short *)((pCVar6->state).uploadbuffer + 0x1e) = (short)_Var13;
        CVar12 = smb_send(conn,0x44,sVar17);
        goto LAB_0013eb8c;
      }
      cVar7 = *(curl_off_t *)((long)local_470 + 0x5c);
      (pCVar6->req).size = cVar7;
      Curl_pgrsSetDownloadSize(pCVar6,cVar7);
      uVar19 = 3;
      (conn->proto).ftpc.pp.response.tv_usec = 0;
switchD_0013e8f9_caseD_0:
      cVar7 = (conn->data->req).offset;
      uStack_466 = 0;
      uStack_465 = 0;
      uStack_459 = 0;
      acStack_455[0] = '\0';
      acStack_455[1] = 0;
      uStack_44f = 0;
      local_468 = 0xc;
      uStack_467 = 0xff;
      uVar3 = *(undefined2 *)((long)(conn->data->req).protop + 0x1a);
      uStack_463 = (undefined1)uVar3;
      uStack_462 = (undefined1)((ushort)uVar3 >> 8);
      uStack_461 = (undefined1)cVar7;
      uStack_460 = (undefined1)((ulong)cVar7 >> 8);
      sStack_45f = (short)((ulong)cVar7 >> 0x10);
      local_453 = (undefined4)((ulong)cVar7 >> 0x20);
      uStack_45d = 0x8000;
      acStack_45b[0] = '\0';
      acStack_45b[1] = 0x80;
      sVar17 = 0x1b;
      cmd = '.';
      goto LAB_0013eb84;
    }
    piVar4[7] = 0x4e;
    (conn->proto).ftpc.pp.response.tv_usec = 0;
    break;
  case 3:
    if ((*(int *)((long)local_470 + 9) == 0) &&
       (0x31 < (ulong)(conn->proto).ftpc.pp.response.tv_usec)) {
      uVar10 = Curl_read16_le((uchar *)((long)local_470 + 0x2f));
      uVar9 = Curl_read16_le((uchar *)((long)pvVar8 + 0x31));
      len = (ulong)uVar10;
      if (uVar10 != 0) {
        if ((ulong)(conn->proto).ftpc.pp.response.tv_usec < len + uVar9 + 4) {
          Curl_failf(conn->data,"Invalid input packet");
          CVar12 = CURLE_RECV_ERROR;
        }
        else {
          CVar12 = Curl_client_write(conn,1,(char *)((long)pvVar8 + (ulong)uVar9 + 4),len);
        }
        if (CVar12 != CURLE_OK) {
          piVar4[7] = CVar12;
          uVar19 = 5;
          (conn->proto).ftpc.pp.response.tv_usec = 0;
          goto switchD_0013e7d7_caseD_0;
        }
      }
      pCVar6 = conn->data;
      lVar18 = (pCVar6->req).bytecount + len;
      (pCVar6->req).bytecount = lVar18;
      pcVar1 = &(pCVar6->req).offset;
      *pcVar1 = *pcVar1 + len;
      Curl_pgrsSetDownloadCounter(pCVar6,lVar18);
      bVar21 = -1 < (short)uVar10;
      uVar19 = bVar21 + 3 + (uint)bVar21;
      (conn->proto).ftpc.pp.response.tv_usec = 0;
      switch(bVar21) {
      case false:
        goto switchD_0013e8f9_caseD_0;
      }
    }
    else {
      piVar4[7] = 0x38;
      uVar19 = 5;
      (conn->proto).ftpc.pp.response.tv_usec = 0;
    }
    goto switchD_0013e7d7_caseD_0;
  case 4:
    if ((*(int *)((long)local_470 + 9) == 0) &&
       (0x29 < (ulong)(conn->proto).ftpc.pp.response.tv_usec)) {
      uVar10 = Curl_read16_le((uchar *)((long)local_470 + 0x29));
      pCVar6 = conn->data;
      lVar18 = (pCVar6->req).bytecount + (ulong)uVar10;
      (pCVar6->req).bytecount = lVar18;
      pcVar1 = &(pCVar6->req).offset;
      *pcVar1 = *pcVar1 + (ulong)uVar10;
      Curl_pgrsSetUploadCounter(pCVar6,lVar18);
      bVar21 = (conn->data->req).bytecount < (conn->data->req).size;
      uVar19 = bVar21 ^ 5;
      (conn->proto).ftpc.pp.response.tv_usec = 0;
      switch(bVar21) {
      case true:
        goto switchD_0013e7d7_caseD_1;
      }
    }
    else {
      piVar4[7] = 0x19;
      uVar19 = 5;
      (conn->proto).ftpc.pp.response.tv_usec = 0;
    }
switchD_0013e7d7_caseD_0:
    uStack_465 = 0;
    uStack_463 = 0;
    uStack_462 = 0;
    uStack_461 = 0;
    uStack_460 = 0;
    local_468 = 3;
    uVar3 = *(undefined2 *)((long)(conn->data->req).protop + 0x1a);
    uStack_467 = (undefined1)uVar3;
    uStack_466 = (undefined1)((ushort)uVar3 >> 8);
    sVar17 = 9;
    cmd = '\x04';
    goto LAB_0013eb84;
  case 5:
    (conn->proto).ftpc.pp.response.tv_usec = 0;
    break;
  case 6:
    (conn->proto).ftpc.pp.response.tv_usec = 0;
LAB_0013ebc4:
    uVar19 = 7;
    CVar12 = piVar4[7];
    *done = true;
    goto LAB_0013eb8c;
  default:
    (conn->proto).ftpc.pp.response.tv_usec = 0;
    return CURLE_OK;
  }
  uVar19 = 6;
  uStack_466 = 0;
  local_468 = 0;
  uStack_467 = 0;
  sVar17 = 3;
  cmd = 'q';
LAB_0013eb84:
  CVar12 = smb_send_message(conn,cmd,&local_468,sVar17);
LAB_0013eb8c:
  if (CVar12 == CURLE_OK) {
    *(uint *)(conn->data->req).protop = uVar19;
  }
  else {
    Curl_conncontrol(conn,1);
    CVar11 = CVar12;
  }
  return CVar11;
}

Assistant:

static CURLcode smb_request_state(struct connectdata *conn, bool *done)
{
  struct smb_request *req = conn->data->req.protop;
  struct smb_header *h;
  struct smb_conn *smbc = &conn->proto.smbc;
  enum smb_req_state next_state = SMB_DONE;
  unsigned short len;
  unsigned short off;
  CURLcode result;
  void *msg = NULL;

  /* Start the request */
  if(req->state == SMB_REQUESTING) {
    result = smb_send_tree_connect(conn);
    if(result) {
      connclose(conn, "SMB: failed to send tree connect message");
      return result;
    }

    request_state(conn, SMB_TREE_CONNECT);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(conn, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(req->state) {
  case SMB_TREE_CONNECT:
    if(h->status) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      break;
    }
    req->tid = smb_swap16(h->tid);
    next_state = SMB_OPEN;
    break;

  case SMB_OPEN:
    if(h->status || smbc->got < sizeof(struct smb_nt_create_response)) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      next_state = SMB_TREE_DISCONNECT;
      break;
    }
    req->fid = smb_swap16(((struct smb_nt_create_response *)msg)->fid);
    conn->data->req.offset = 0;
    if(conn->data->set.upload) {
      conn->data->req.size = conn->data->state.infilesize;
      Curl_pgrsSetUploadSize(conn->data, conn->data->req.size);
      next_state = SMB_UPLOAD;
    }
    else {
      conn->data->req.size =
        smb_swap64(((struct smb_nt_create_response *)msg)->end_of_file);
      Curl_pgrsSetDownloadSize(conn->data, conn->data->req.size);
      next_state = SMB_DOWNLOAD;
    }
    break;

  case SMB_DOWNLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 14) {
      req->result = CURLE_RECV_ERROR;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 11);
    off = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 13);
    if(len > 0) {
      if(off + sizeof(unsigned int) + len > smbc->got) {
        failf(conn->data, "Invalid input packet");
        result = CURLE_RECV_ERROR;
      }
      else
        result = Curl_client_write(conn, CLIENTWRITE_BODY,
                                   (char *)msg + off + sizeof(unsigned int),
                                   len);
      if(result) {
        req->result = result;
        next_state = SMB_CLOSE;
        break;
      }
    }
    conn->data->req.bytecount += len;
    conn->data->req.offset += len;
    Curl_pgrsSetDownloadCounter(conn->data, conn->data->req.bytecount);
    next_state = (len < MAX_PAYLOAD_SIZE) ? SMB_CLOSE : SMB_DOWNLOAD;
    break;

  case SMB_UPLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 6) {
      req->result = CURLE_UPLOAD_FAILED;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 5);
    conn->data->req.bytecount += len;
    conn->data->req.offset += len;
    Curl_pgrsSetUploadCounter(conn->data, conn->data->req.bytecount);
    if(conn->data->req.bytecount >= conn->data->req.size)
      next_state = SMB_CLOSE;
    else
      next_state = SMB_UPLOAD;
    break;

  case SMB_CLOSE:
    /* We don't care if the close failed, proceed to tree disconnect anyway */
    next_state = SMB_TREE_DISCONNECT;
    break;

  case SMB_TREE_DISCONNECT:
    next_state = SMB_DONE;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  switch(next_state) {
  case SMB_OPEN:
    result = smb_send_open(conn);
    break;

  case SMB_DOWNLOAD:
    result = smb_send_read(conn);
    break;

  case SMB_UPLOAD:
    result = smb_send_write(conn);
    break;

  case SMB_CLOSE:
    result = smb_send_close(conn);
    break;

  case SMB_TREE_DISCONNECT:
    result = smb_send_tree_disconnect(conn);
    break;

  case SMB_DONE:
    result = req->result;
    *done = true;
    break;

  default:
    break;
  }

  if(result) {
    connclose(conn, "SMB: failed to send message");
    return result;
  }

  request_state(conn, next_state);

  return CURLE_OK;
}